

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fop.c
# Opt level: O0

Qiniu_Error
Qiniu_FOP_Pfop(Qiniu_Client *self,Qiniu_FOP_PfopRet *ret,char *bucket,char *key,char **fops,
              int fopCount,char *pipeline,char *notifyURL,int force)

{
  Qiniu_Error QVar1;
  undefined1 auStack_88 [8];
  Qiniu_FOP_PfopParams params;
  int fopCount_local;
  char **fops_local;
  char *key_local;
  char *bucket_local;
  Qiniu_FOP_PfopRet *ret_local;
  Qiniu_Client *self_local;
  
  params.fopCount = 0;
  params.force = 0;
  params.notifyURL = (char *)0x0;
  params.key = pipeline;
  params.pipeline = notifyURL;
  params.fops = (char **)CONCAT44(force,fopCount);
  auStack_88 = (undefined1  [8])bucket;
  params.bucket = key;
  params.workflowTemplateID = (char *)fops;
  params._60_4_ = fopCount;
  QVar1 = Qiniu_FOP_Pfop_v2(self,ret,(Qiniu_FOP_PfopParams *)auStack_88);
  QVar1._4_4_ = 0;
  return QVar1;
}

Assistant:

Qiniu_Error Qiniu_FOP_Pfop(Qiniu_Client *self, Qiniu_FOP_PfopRet *ret, const char *bucket, const char *key,
                           char *fops[], int fopCount, const char *pipeline, const char *notifyURL, int force)
{
    Qiniu_FOP_PfopParams params;
    Qiniu_Zero(params);
    params.bucket = bucket;
    params.key = key;
    params.fops = (char **)fops;
    params.fopCount = fopCount;
    params.pipeline = pipeline;
    params.notifyURL = notifyURL;
    params.force = force;
    return Qiniu_FOP_Pfop_v2(self, ret, &params);
}